

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O1

void cff_index_done(CFF_Index idx)

{
  FT_Stream stream;
  FT_Memory memory;
  
  stream = idx->stream;
  if (stream != (FT_Stream)0x0) {
    memory = stream->memory;
    if (idx->bytes != (FT_Byte *)0x0) {
      FT_Stream_ReleaseFrame(stream,&idx->bytes);
    }
    ft_mem_free(memory,idx->offsets);
    idx->offsets = (FT_ULong *)0x0;
    idx->bytes = (FT_Byte *)0x0;
    idx->data_offset = 0;
    idx->data_size = 0;
    idx->hdr_size = 0;
    idx->count = 0;
    *(undefined8 *)&idx->off_size = 0;
    idx->stream = (FT_Stream)0x0;
    idx->start = 0;
  }
  return;
}

Assistant:

static void
  cff_index_done( CFF_Index  idx )
  {
    if ( idx->stream )
    {
      FT_Stream  stream = idx->stream;
      FT_Memory  memory = stream->memory;


      if ( idx->bytes )
        FT_FRAME_RELEASE( idx->bytes );

      FT_FREE( idx->offsets );
      FT_ZERO( idx );
    }
  }